

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRStereoNode.cpp
# Opt level: O0

VRDisplayNode *
MinVR::VRStereoNode::create(VRMainInterface *vrMain,VRDataIndex *config,string *nameSpace)

{
  bool bVar1;
  undefined8 uVar2;
  VRDisplayNode *pVVar3;
  string *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long *in_RDI;
  VRDisplayNode *node;
  VRStereoFormat format;
  string formatStr;
  float iod;
  VRGraphicsToolkit *gfxToolkit;
  VRDatumConverter<MinVR::VRDatum> *in_stack_fffffffffffffd28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffd64;
  char *in_stack_fffffffffffffd68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd70;
  string local_210 [36];
  VRStereoFormat in_stack_fffffffffffffe14;
  VRGraphicsToolkit *in_stack_fffffffffffffe18;
  float in_stack_fffffffffffffe24;
  string *in_stack_fffffffffffffe28;
  VRStereoNode *in_stack_fffffffffffffe30;
  string local_1c0 [39];
  allocator<char> local_199;
  string local_198 [32];
  VRDatum_conflict *local_178;
  string local_170 [39];
  allocator<char> local_149;
  string local_148 [32];
  VRDatum_conflict *local_128;
  undefined4 local_11c;
  string local_118 [39];
  allocator<char> local_f1;
  string local_f0 [32];
  VRDatum_conflict *local_d0;
  string local_c8 [36];
  VRFloat local_a4;
  string local_a0 [39];
  undefined1 in_stack_ffffffffffffff87;
  string *in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffff90;
  VRDataIndex *in_stack_ffffffffffffff98;
  string local_40 [32];
  undefined8 local_20;
  string *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
  std::__cxx11::string::string(local_a0,local_18);
  VRDataIndex::getValue
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
             (bool)in_stack_ffffffffffffff87);
  VRDatumConverter::operator_cast_to_string(in_stack_fffffffffffffd28);
  uVar2 = (**(code **)(*in_RDI + 0x28))(in_RDI,local_40);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
  local_a4 = 0.0;
  local_20 = uVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
  std::__cxx11::string::string(local_118,local_18);
  local_d0 = (VRDatum_conflict *)
             VRDataIndex::getValue
                       (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                        in_stack_ffffffffffffff88,(bool)in_stack_ffffffffffffff87);
  VRDatumConverter::operator_cast_to_string(in_stack_fffffffffffffd28);
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator(&local_f1);
  local_11c = 0;
  bVar1 = std::operator==(in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28);
  if (bVar1) {
    local_11c = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    std::__cxx11::string::string(local_170,local_18);
    local_128 = (VRDatum_conflict *)
                VRDataIndex::getValue
                          (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                           in_stack_ffffffffffffff88,(bool)in_stack_ffffffffffffff87);
    local_a4 = VRDatumConverter::operator_cast_to_float
                         ((VRDatumConverter<MinVR::VRDatum> *)0x17cce0);
    std::__cxx11::string::~string(local_170);
    std::__cxx11::string::~string(local_148);
    std::allocator<char>::~allocator(&local_149);
  }
  else {
    bVar1 = std::operator==(in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28);
    if (bVar1) {
      local_11c = 2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_10,in_stack_fffffffffffffd68,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      std::__cxx11::string::string(local_1c0,local_18);
      local_178 = (VRDatum_conflict *)
                  VRDataIndex::getValue
                            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                             in_stack_ffffffffffffff88,(bool)in_stack_ffffffffffffff87);
      local_a4 = VRDatumConverter::operator_cast_to_float
                           ((VRDatumConverter<MinVR::VRDatum> *)0x17cf66);
      std::__cxx11::string::~string(local_1c0);
      std::__cxx11::string::~string(local_198);
      std::allocator<char>::~allocator(&local_199);
    }
    else {
      bVar1 = std::operator==(in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28);
      uVar4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd60);
      if (bVar1) {
        local_11c = 3;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                   (allocator<char> *)CONCAT44(in_stack_fffffffffffffd64,uVar4));
        std::__cxx11::string::string(local_210,local_18);
        VRDataIndex::getValue
                  (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                   (bool)in_stack_ffffffffffffff87);
        local_a4 = VRDatumConverter::operator_cast_to_float
                             ((VRDatumConverter<MinVR::VRDatum> *)0x17d0d8);
        std::__cxx11::string::~string(local_210);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffe18);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe17);
      }
    }
  }
  pVVar3 = (VRDisplayNode *)operator_new(0x80);
  VRStereoNode(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
               in_stack_fffffffffffffe18,in_stack_fffffffffffffe14);
  std::__cxx11::string::~string(local_c8);
  return pVVar3;
}

Assistant:

VRDisplayNode* VRStereoNode::create(VRMainInterface *vrMain, VRDataIndex *config, const std::string &nameSpace)
{

	VRGraphicsToolkit *gfxToolkit = vrMain->getGraphicsToolkit(config->getValue("GraphicsToolkit", nameSpace));
	float iod = 0.0f;
	std::string formatStr = config->getValue("StereoFormat", nameSpace);
	VRStereoNode::VRStereoFormat format = VRStereoNode::VRSTEREOFORMAT_MONO;
	if (formatStr == "QuadBuffered") {
		format = VRStereoNode::VRSTEREOFORMAT_QUADBUFFERED;
		iod = (float)config->getValue("EyeSeparation", nameSpace);
	}
	else if (formatStr == "SideBySide") {
		format = VRStereoNode::VRSTEREOFORMAT_SIDEBYSIDE;
		iod = (float)config->getValue("EyeSeparation", nameSpace);
	}
	else if (formatStr == "ColumnInterlaced") {
		format = VRStereoNode::VRSTEREOFORMAT_COLUMNINTERLACED;
		iod = (float)config->getValue("EyeSeparation", nameSpace);
	}

	VRDisplayNode *node = new VRStereoNode(nameSpace, iod, gfxToolkit, format);

	return node;
}